

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O0

Builder * capnp::_::WireHelpers::getWritableTextPointer
                    (Builder *__return_storage_ptr__,WirePointer *ref,word *refTarget,
                    SegmentBuilder *segment,CapTableBuilder *capTable,void *defaultValue,
                    TextSize defaultSize)

{
  Fault value;
  bool bVar1;
  ElementSize EVar2;
  Kind KVar3;
  ElementCountN<29> a;
  uint uVar4;
  uchar *to;
  Builder *builder;
  Fault local_b8;
  Fault f_3;
  Fault local_a8;
  Fault f_2;
  uint *size;
  Maybe<unsigned_int> maybeSize;
  Fault f_1;
  Fault local_78;
  Fault f;
  byte *bptr;
  word *ptr;
  SegmentAnd<capnp::Text::Builder> local_50;
  byte *local_30;
  void *defaultValue_local;
  CapTableBuilder *capTable_local;
  SegmentBuilder *segment_local;
  word *refTarget_local;
  WirePointer *ref_local;
  
  local_30 = (byte *)defaultValue;
  defaultValue_local = capTable;
  capTable_local = (CapTableBuilder *)segment;
  segment_local = (SegmentBuilder *)refTarget;
  refTarget_local = (word *)ref;
  bVar1 = WirePointer::isNull(ref);
  if (!bVar1) {
    f.exception = (Exception *)
                  followFars((WirePointer **)&refTarget_local,(word *)segment_local,
                             (SegmentBuilder **)&capTable_local);
    KVar3 = WirePointer::kind((WirePointer *)refTarget_local);
    if (KVar3 == LIST) {
      EVar2 = WirePointer::ListRef::elementSize((ListRef *)((long)&refTarget_local->content + 4));
      if (EVar2 == BYTE) {
        a = WirePointer::ListRef::elementCount((ListRef *)((long)&refTarget_local->content + 4));
        trySubtract<unsigned_int,unsigned_int>((capnp *)&size,a,1);
        f_2.exception = (Exception *)kj::_::readMaybe<unsigned_int>((Maybe<unsigned_int> *)&size);
        value = f;
        if (f_2.exception == (Exception *)0x0) {
          kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[51]>
                    (&local_b8,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                     ,0x689,FAILED,(char *)0x0,
                     "\"zero-size blob can\'t be text (need NUL terminator)\"",
                     (char (*) [51])"zero-size blob can\'t be text (need NUL terminator)");
          f_3.exception._4_4_ = 2;
          kj::_::Debug::Fault::~Fault(&local_b8);
        }
        else if (*(char *)((long)(f.exception)->trace +
                          ((ulong)*(uint *)&((f_2.exception)->ownFile).content.ptr - 0x50)) == '\0')
        {
          uVar4 = unbound<unsigned_int>(*(uint *)&((f_2.exception)->ownFile).content.ptr);
          Text::Builder::Builder(__return_storage_ptr__,(char *)value.exception,(ulong)uVar4);
          f_3.exception._4_4_ = 1;
        }
        else {
          kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[34]>
                    (&local_a8,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                     ,0x683,FAILED,"*(bptr + *size) == \'\\0\'",
                     "\"Text blob missing NUL terminator.\"",
                     (char (*) [34])"Text blob missing NUL terminator.");
          f_3.exception._4_4_ = 2;
          kj::_::Debug::Fault::~Fault(&local_a8);
        }
        kj::Maybe<unsigned_int>::~Maybe((Maybe<unsigned_int> *)&size);
        if (f_3.exception._4_4_ == 1) {
          return __return_storage_ptr__;
        }
      }
      else {
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[77]>
                  ((Fault *)&maybeSize,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                   ,0x67c,FAILED,"ref->listRef.elementSize() == ElementSize::BYTE",
                   "\"Called getText{Field,Element}() but existing list pointer is not byte-sized.\""
                   ,(char (*) [77])
                    "Called getText{Field,Element}() but existing list pointer is not byte-sized.");
        kj::_::Debug::Fault::~Fault((Fault *)&maybeSize);
      }
    }
    else {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[68]>
                (&local_78,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                 ,0x678,FAILED,"ref->kind() == WirePointer::LIST",
                 "\"Called getText{Field,Element}() but existing pointer is not a list.\"",
                 (char (*) [68])
                 "Called getText{Field,Element}() but existing pointer is not a list.");
      kj::_::Debug::Fault::~Fault(&local_78);
    }
  }
  if (defaultSize == 0) {
    Text::Builder::Builder(__return_storage_ptr__,(void *)0x0);
  }
  else {
    initTextPointer(&local_50,(WirePointer *)refTarget_local,(SegmentBuilder *)capTable_local,
                    (CapTableBuilder *)defaultValue_local,defaultSize,(BuilderArena *)0x0);
    *(undefined8 *)__return_storage_ptr__ = local_50.value._0_8_;
    (__return_storage_ptr__->content).ptr = local_50.value.content.ptr;
    (__return_storage_ptr__->content).size_ = local_50.value.content.size_;
    _ptr = Text::Builder::asBytes(__return_storage_ptr__);
    to = kj::ArrayPtr<unsigned_char>::begin((ArrayPtr<unsigned_char> *)&ptr);
    copyMemory(to,local_30,defaultSize);
  }
  return __return_storage_ptr__;
}

Assistant:

static KJ_ALWAYS_INLINE(Text::Builder getWritableTextPointer(
      WirePointer* ref, word* refTarget, SegmentBuilder* segment, CapTableBuilder* capTable,
      const void* defaultValue, TextSize defaultSize)) {
    if (ref->isNull()) {
    useDefault:
      if (defaultSize == ZERO * BYTES) {
        return nullptr;
      } else {
        Text::Builder builder = initTextPointer(ref, segment, capTable, defaultSize).value;
        copyMemory(builder.asBytes().begin(), reinterpret_cast<const byte*>(defaultValue),
                   defaultSize);
        return builder;
      }
    } else {
      word* ptr = followFars(ref, refTarget, segment);
      byte* bptr = reinterpret_cast<byte*>(ptr);

      KJ_REQUIRE(ref->kind() == WirePointer::LIST,
          "Called getText{Field,Element}() but existing pointer is not a list.") {
        goto useDefault;
      }
      KJ_REQUIRE(ref->listRef.elementSize() == ElementSize::BYTE,
          "Called getText{Field,Element}() but existing list pointer is not byte-sized.") {
        goto useDefault;
      }

      auto maybeSize = trySubtract(ref->listRef.elementCount() * (ONE * BYTES / ELEMENTS),
                                   ONE * BYTES);
      KJ_IF_MAYBE(size, maybeSize) {
        KJ_REQUIRE(*(bptr + *size) == '\0', "Text blob missing NUL terminator.") {
          goto useDefault;
        }

        return Text::Builder(reinterpret_cast<char*>(bptr), unbound(*size / BYTES));
      } else {
        KJ_FAIL_REQUIRE("zero-size blob can't be text (need NUL terminator)") {
          goto useDefault;
        };
      }